

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O0

void __thiscall xe::xml::Tokenizer::advance(Tokenizer *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int local_1d0;
  int local_1cc;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  int local_120;
  allocator<char> local_119;
  int prevChar;
  allocator<char> local_f1;
  string local_f0;
  int local_cc;
  int local_c8;
  int prev1;
  int prev2;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  int local_14;
  Tokenizer *pTStack_10;
  int curChar;
  Tokenizer *this_local;
  
  pTStack_10 = this;
  if (this->m_curToken != TOKEN_INCOMPLETE) {
    if ((((this->m_curToken == TOKEN_TAG_END) || (this->m_curToken == TOKEN_EMPTY_ELEMENT_END)) ||
        (this->m_curToken == TOKEN_PROCESSING_INSTRUCTION_END)) ||
       ((this->m_curToken == TOKEN_COMMENT || (this->m_curToken == TOKEN_ENTITY)))) {
      this->m_state = STATE_DATA;
    }
    de::RingBuffer<unsigned_char>::popBack(&this->m_buf,this->m_curTokenLen);
    this->m_curToken = TOKEN_INCOMPLETE;
    this->m_curTokenLen = 0;
    iVar2 = getChar(this,0);
    if (iVar2 == 0) {
      this->m_curToken = TOKEN_END_OF_STRING;
      this->m_curTokenLen = 1;
      return;
    }
  }
  local_14 = getChar(this,this->m_curTokenLen);
  do {
    while (this->m_state != STATE_DATA) {
      if (this->m_curTokenLen == 0) {
        while (bVar1 = isWhitespaceChar(local_14), bVar1) {
          de::RingBuffer<unsigned_char>::popBack(&this->m_buf);
          local_14 = getChar(this,0);
        }
      }
      if (local_14 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"Unexpected end of string",&local_39);
        error(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
      }
      else if (local_14 == -1) {
        return;
      }
      iVar2 = local_14;
      if (this->m_curTokenLen == 0) {
        if ((local_14 == 0x27) || (local_14 == 0x22)) {
          this->m_state = STATE_VALUE;
        }
        else {
          bVar1 = isIdentifierStartChar(local_14);
          if (bVar1) {
            this->m_state = STATE_IDENTIFIER;
          }
          else if (((local_14 == 0x3c) || (local_14 == 0x3f)) || (local_14 == 0x2f)) {
            this->m_state = STATE_TAG;
          }
          else if (local_14 != 0x26) {
            if (local_14 == 0x3d) {
              this->m_curToken = TOKEN_EQUAL;
              this->m_curTokenLen = 1;
              return;
            }
            if (local_14 == 0x3e) {
              this->m_curToken = TOKEN_TAG_END;
              this->m_curTokenLen = 1;
              return;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"Unexpected character",&local_71);
            error(this,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::allocator<char>::~allocator(&local_71);
          }
        }
      }
      else if (this->m_state == STATE_IDENTIFIER) {
        bVar1 = isIdentifierChar(local_14);
        if (!bVar1) {
          this->m_curToken = TOKEN_IDENTIFIER;
          return;
        }
      }
      else if (this->m_state == STATE_VALUE) {
        if ((local_14 == 0x27) || (local_14 == 0x22)) {
          iVar3 = getChar(this,0);
          if (iVar2 != iVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"Mismatched quote",&local_99);
            error(this,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::allocator<char>::~allocator(&local_99);
          }
          this->m_curToken = TOKEN_STRING;
          this->m_curTokenLen = this->m_curTokenLen + 1;
          return;
        }
      }
      else if (this->m_state == STATE_COMMENT) {
        if (this->m_curTokenLen < 4) {
          if (local_14 != 0x2d) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&prev2,"Invalid comment start",
                       (allocator<char> *)((long)&prev1 + 3));
            error(this,(string *)&prev2);
            std::__cxx11::string::~string((string *)&prev2);
            std::allocator<char>::~allocator((allocator<char> *)((long)&prev1 + 3));
          }
        }
        else {
          if (this->m_curTokenLen < 6) {
            local_1cc = 0;
          }
          else {
            local_1cc = getChar(this,this->m_curTokenLen + -2);
          }
          local_c8 = local_1cc;
          if (this->m_curTokenLen < 5) {
            local_1d0 = 0;
          }
          else {
            local_1d0 = getChar(this,this->m_curTokenLen + -1);
          }
          local_cc = local_1d0;
          if ((local_c8 == 0x2d) && (local_1d0 == 0x2d)) {
            if (local_14 != 0x3e) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f0,"Invalid comment end",&local_f1);
              error(this,&local_f0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::allocator<char>::~allocator(&local_f1);
            }
            this->m_curToken = TOKEN_COMMENT;
            this->m_curTokenLen = this->m_curTokenLen + 1;
            return;
          }
        }
      }
      else if (this->m_state == STATE_ENTITY) {
        if (0 < this->m_curTokenLen) {
          if (local_14 == 0x3b) {
            this->m_curToken = TOKEN_ENTITY;
            this->m_curTokenLen = this->m_curTokenLen + 1;
            return;
          }
          bVar1 = de::inRange<int>(local_14,0x30,0x39);
          if (((!bVar1) && (bVar1 = de::inRange<int>(local_14,0x61,0x7a), !bVar1)) &&
             (bVar1 = de::inRange<int>(local_14,0x41,0x5a), !bVar1)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&prevChar,"Invalid entity",&local_119);
            error(this,(string *)&prevChar);
            std::__cxx11::string::~string((string *)&prevChar);
            std::allocator<char>::~allocator(&local_119);
          }
        }
      }
      else {
        local_120 = getChar(this,this->m_curTokenLen + -1);
        if (local_120 == 0x3c) {
          if (local_14 == 0x2f) {
            this->m_curToken = TOKEN_END_TAG_START;
            this->m_curTokenLen = 2;
            return;
          }
          if (local_14 == 0x3f) {
            this->m_curToken = TOKEN_PROCESSING_INSTRUCTION_START;
            this->m_curTokenLen = 2;
            return;
          }
          if (local_14 != 0x21) {
            this->m_curToken = TOKEN_TAG_START;
            this->m_curTokenLen = 1;
            return;
          }
          this->m_state = STATE_COMMENT;
        }
        else {
          if (local_120 == 0x3f) {
            if (local_14 != 0x3e) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_140,"Invalid processing instruction end",&local_141);
              error(this,&local_140);
              std::__cxx11::string::~string((string *)&local_140);
              std::allocator<char>::~allocator(&local_141);
            }
            this->m_curToken = TOKEN_PROCESSING_INSTRUCTION_END;
            this->m_curTokenLen = 2;
            return;
          }
          if (local_120 == 0x2f) {
            if (local_14 != 0x3e) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_168,"Invalid empty element end",&local_169);
              error(this,&local_168);
              std::__cxx11::string::~string((string *)&local_168);
              std::allocator<char>::~allocator(&local_169);
            }
            this->m_curToken = TOKEN_EMPTY_ELEMENT_END;
            this->m_curTokenLen = 2;
            return;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,"Could not parse special token",&local_191);
          error(this,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator(&local_191);
        }
      }
LAB_0015f57c:
      this->m_curTokenLen = this->m_curTokenLen + 1;
      local_14 = getChar(this,this->m_curTokenLen);
    }
    if (((local_14 != 0) && (local_14 != -1)) && ((local_14 != 0x3c && (local_14 != 0x26))))
    goto LAB_0015f57c;
    if (local_14 == 0x3c) {
      this->m_state = STATE_TAG;
    }
    else if (local_14 == 0x26) {
      this->m_state = STATE_ENTITY;
    }
    if (0 < this->m_curTokenLen) {
      this->m_curToken = TOKEN_DATA;
      return;
    }
    if (local_14 == 0) {
      return;
    }
    if (local_14 == -1) {
      return;
    }
  } while( true );
}

Assistant:

void Tokenizer::advance (void)
{
	if (m_curToken != TOKEN_INCOMPLETE)
	{
		// Parser should not try to advance beyond end of string.
		DE_ASSERT(m_curToken != TOKEN_END_OF_STRING);

		// If current token is tag end, change state to data.
		if (m_curToken == TOKEN_TAG_END						||
			m_curToken == TOKEN_EMPTY_ELEMENT_END			||
			m_curToken == TOKEN_PROCESSING_INSTRUCTION_END	||
			m_curToken == TOKEN_COMMENT						||
			m_curToken == TOKEN_ENTITY)
			m_state = STATE_DATA;

		// Advance buffer by length of last token.
		m_buf.popBack(m_curTokenLen);

		// Reset state.
		m_curToken		= TOKEN_INCOMPLETE;
		m_curTokenLen	= 0;

		// If we hit end of string here, report it as end of string.
		if (getChar(0) == END_OF_STRING)
		{
			m_curToken		= TOKEN_END_OF_STRING;
			m_curTokenLen	= 1;
			return;
		}
	}

	int curChar = getChar(m_curTokenLen);

	for (;;)
	{
		if (m_state == STATE_DATA)
		{
			// Advance until we hit end of buffer or tag start and treat that as data token.
			if (curChar == END_OF_STRING || curChar == (int)END_OF_BUFFER || curChar == '<' || curChar == '&')
			{
				if (curChar == '<')
					m_state = STATE_TAG;
				else if (curChar == '&')
					m_state = STATE_ENTITY;

				if (m_curTokenLen > 0)
				{
					// Report data token.
					m_curToken = TOKEN_DATA;
					return;
				}
				else if (curChar == END_OF_STRING || curChar == (int)END_OF_BUFFER)
				{
					// Just return incomplete token, no data parsed.
					return;
				}
				else
				{
					DE_ASSERT(m_state == STATE_TAG || m_state == STATE_ENTITY);
					continue;
				}
			}
		}
		else
		{
			// Eat all whitespace if present.
			if (m_curTokenLen == 0)
			{
				while (isWhitespaceChar(curChar))
				{
					m_buf.popBack();
					curChar = getChar(0);
				}
			}

			// Handle end of string / buffer.
			if (curChar == END_OF_STRING)
				error("Unexpected end of string");
			else if (curChar == (int)END_OF_BUFFER)
			{
				DE_ASSERT(m_curToken == TOKEN_INCOMPLETE);
				return;
			}

			if (m_curTokenLen == 0)
			{
				// Expect start of identifier, value or special tag token.
				if (curChar == '\'' || curChar == '"')
					m_state = STATE_VALUE;
				else if (isIdentifierStartChar(curChar))
					m_state = STATE_IDENTIFIER;
				else if (curChar == '<' || curChar == '?' || curChar == '/')
					m_state = STATE_TAG;
				else if (curChar == '&')
					DE_ASSERT(m_state == STATE_ENTITY);
				else if (curChar == '=')
				{
					m_curToken		= TOKEN_EQUAL;
					m_curTokenLen	= 1;
					return;
				}
				else if (curChar == '>')
				{
					m_curToken		= TOKEN_TAG_END;
					m_curTokenLen	= 1;
					return;
				}
				else
					error("Unexpected character");
			}
			else if (m_state == STATE_IDENTIFIER)
			{
				if (!isIdentifierChar(curChar))
				{
					m_curToken = TOKEN_IDENTIFIER;
					return;
				}
			}
			else if (m_state == STATE_VALUE)
			{
				// \todo [2012-06-07 pyry] Escapes.
				if (curChar == '\'' || curChar == '"')
				{
					// \todo [2012-10-17 pyry] Should we actually do the check against getChar(0)?
					if (curChar != getChar(0))
						error("Mismatched quote");
					m_curToken		 = TOKEN_STRING;
					m_curTokenLen	+= 1;
					return;
				}
			}
			else if (m_state == STATE_COMMENT)
			{
				DE_ASSERT(m_curTokenLen >= 2); // 2 characters have been parsed if we are in comment state.

				if (m_curTokenLen <= 3)
				{
					if (curChar != '-')
						error("Invalid comment start");
				}
				else
				{
					int prev2 = m_curTokenLen > 5 ? getChar(m_curTokenLen-2) : 0;
					int prev1 = m_curTokenLen > 4 ? getChar(m_curTokenLen-1) : 0;

					if (prev2 == '-' && prev1 == '-')
					{
						if (curChar != '>')
							error("Invalid comment end");
						m_curToken		 = TOKEN_COMMENT;
						m_curTokenLen	+= 1;
						return;
					}
				}
			}
			else if (m_state == STATE_ENTITY)
			{
				if (m_curTokenLen >= 1)
				{
					if (curChar == ';')
					{
						m_curToken		 = TOKEN_ENTITY;
						m_curTokenLen	+= 1;
						return;
					}
					else if (!de::inRange<int>(curChar, '0', '9')	&&
							 !de::inRange<int>(curChar, 'a', 'z')	&&
							 !de::inRange<int>(curChar, 'A', 'Z'))
						error("Invalid entity");
				}
			}
			else
			{
				// Special tokens are at most 2 characters.
				DE_ASSERT(m_state == STATE_TAG && m_curTokenLen == 1);

				int prevChar = getChar(m_curTokenLen-1);

				if (prevChar == '<')
				{
					// Tag start.
					if (curChar == '/')
					{
						m_curToken		= TOKEN_END_TAG_START;
						m_curTokenLen	= 2;
						return;
					}
					else if (curChar == '?')
					{
						m_curToken		= TOKEN_PROCESSING_INSTRUCTION_START;
						m_curTokenLen	= 2;
						return;
					}
					else if (curChar == '!')
					{
						m_state = STATE_COMMENT;
					}
					else
					{
						m_curToken		= TOKEN_TAG_START;
						m_curTokenLen	= 1;
						return;
					}
				}
				else if (prevChar == '?')
				{
					if (curChar != '>')
						error("Invalid processing instruction end");
					m_curToken		= TOKEN_PROCESSING_INSTRUCTION_END;
					m_curTokenLen	= 2;
					return;
				}
				else if (prevChar == '/')
				{
					if (curChar != '>')
						error("Invalid empty element end");
					m_curToken		= TOKEN_EMPTY_ELEMENT_END;
					m_curTokenLen	= 2;
					return;
				}
				else
					error("Could not parse special token");
			}
		}

		m_curTokenLen	+= 1;
		curChar			 = getChar(m_curTokenLen);
	}
}